

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderRenderCase.cpp
# Opt level: O2

char * deqp::gls::getFloatUniformName(int number)

{
  if ((uint)number < 9) {
    return &DAT_01903280 + *(int *)(&DAT_01903280 + (ulong)(uint)number * 4);
  }
  return glcts::fixed_sample_locations_values + 1;
}

Assistant:

const char* getFloatUniformName (int number)
{
	switch (number)
	{
		case 0:	return "uf_zero";
		case 1: return "uf_one";
		case 2: return "uf_two";
		case 3: return "uf_three";
		case 4: return "uf_four";
		case 5: return "uf_five";
		case 6: return "uf_six";
		case 7: return "uf_seven";
		case 8: return "uf_eight";
		default:
			DE_ASSERT(false);
			return "";
	}
}